

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O0

void __thiscall
PSVIWriterHandlers::processModelGroupDefinition
          (PSVIWriterHandlers *this,XSModelGroupDefinition *modelGroup)

{
  XMLCh *pXVar1;
  XSModelGroup *modelGroup_00;
  XSAnnotation *annotation;
  XSModelGroupDefinition *modelGroup_local;
  PSVIWriterHandlers *this_local;
  
  if (modelGroup == (XSModelGroupDefinition *)0x0) {
    sendElementEmpty(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgModelGroupDefinition);
  }
  else {
    sendIndentedElementWithID
              (this,(XMLCh *)&xercesc_4_0::PSVIUni::fgModelGroupDefinition,(XSObject *)modelGroup);
    pXVar1 = (XMLCh *)(**(code **)(*(long *)modelGroup + 0x10))();
    sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgName,pXVar1);
    pXVar1 = (XMLCh *)(**(code **)(*(long *)modelGroup + 0x18))();
    sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgTargetNamespace,pXVar1);
    modelGroup_00 = (XSModelGroup *)xercesc_4_0::XSModelGroupDefinition::getModelGroup();
    processModelGroup(this,modelGroup_00);
    annotation = xercesc_4_0::XSModelGroupDefinition::getAnnotation(modelGroup);
    processAnnotation(this,annotation);
    sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgModelGroupDefinition);
  }
  return;
}

Assistant:

void PSVIWriterHandlers::processModelGroupDefinition(XSModelGroupDefinition* modelGroup) {
	if (modelGroup == NULL) {
		sendElementEmpty(PSVIUni::fgModelGroupDefinition);
	} else {
		sendIndentedElementWithID(PSVIUni::fgModelGroupDefinition, (XSObject*) modelGroup);
		sendElementValue(PSVIUni::fgName, modelGroup->getName());
		sendElementValue(PSVIUni::fgTargetNamespace, modelGroup->getNamespace());
		processModelGroup(modelGroup->getModelGroup());
		processAnnotation(modelGroup->getAnnotation());
		sendUnindentedElement(PSVIUni::fgModelGroupDefinition);
	}
}